

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-h2.c
# Opt level: O3

int rops_init_vhost_h2(lws_vhost *vh,lws_context_creation_info *info)

{
  lws_context *plVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  
  plVar1 = vh->context;
  (vh->h2).set.s[8] = (plVar1->set).s[8];
  uVar2 = *(undefined8 *)(plVar1->set).s;
  uVar3 = *(undefined8 *)((plVar1->set).s + 2);
  uVar4 = *(undefined8 *)((plVar1->set).s + 6);
  *(undefined8 *)((vh->h2).set.s + 4) = *(undefined8 *)((plVar1->set).s + 4);
  *(undefined8 *)((vh->h2).set.s + 6) = uVar4;
  *(undefined8 *)(vh->h2).set.s = uVar2;
  *(undefined8 *)((vh->h2).set.s + 2) = uVar3;
  if (info->http2_settings[0] != 0) {
    lVar5 = 0;
    do {
      (vh->h2).set.s[lVar5 + 1] = info->http2_settings[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 5);
  }
  return 0;
}

Assistant:

static int
rops_init_vhost_h2(struct lws_vhost *vh,
		   const struct lws_context_creation_info *info)
{
	vh->h2.set = vh->context->set;
	if (info->http2_settings[0]) {
		int n;

		for (n = 1; n < LWS_H2_SETTINGS_LEN; n++)
			vh->h2.set.s[n] = info->http2_settings[n];
	}

	return 0;
}